

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  uint uVar1;
  LZ4_stream_t_internal *pLVar2;
  int iVar3;
  U16 UVar4;
  U16 UVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  BYTE *pBVar14;
  reg_t rVar15;
  reg_t rVar16;
  char *pcVar17;
  BYTE *pBVar18;
  bool bVar19;
  LZ4_byte *local_1140;
  LZ4_byte *local_1138;
  LZ4_byte *local_1048;
  LZ4_byte *local_1040;
  int local_101c;
  int result;
  LZ4_stream_t_internal *streamPtr;
  int srcSize_local;
  char *dest_local;
  char *source_local;
  LZ4_stream_t *LZ4_dict_local;
  int local_fac;
  int local_f64;
  char *local_f60;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *pBStack_e50;
  U32 startIndex;
  BYTE *ip;
  int result_1;
  U32 h_6;
  U32 h_4;
  U32 h;
  char *local_d88;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *pBStack_c78;
  U32 startIndex_1;
  BYTE *ip_1;
  int result_2;
  U32 h_14;
  U32 h_12;
  U32 h_8;
  U16 *hashTable_32;
  U32 *hashTable_31;
  BYTE **hashTable_30;
  U16 *hashTable_47;
  U32 *hashTable_46;
  BYTE **hashTable_45;
  U16 *hashTable_44;
  U32 *hashTable_43;
  BYTE **hashTable_42;
  U16 *hashTable_29;
  U32 *hashTable_28;
  BYTE **hashTable_27;
  U16 *hashTable_5;
  U32 *hashTable_4;
  BYTE **hashTable_3;
  U16 *hashTable_20;
  U32 *hashTable_19;
  BYTE **hashTable_18;
  U16 *hashTable_17;
  U32 *hashTable_16;
  BYTE **hashTable_15;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U16 *hashTable_36;
  U32 *hashTable_35;
  U16 *hashTable_51;
  U32 *hashTable_50;
  U16 *hashTable_49;
  U32 *hashTable_48;
  U16 *hashTable_34;
  U32 *hashTable_33;
  U16 *hashTable_9;
  U32 *hashTable_8;
  U16 *hashTable_24;
  U32 *hashTable_23;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U16 *hashTable_38;
  U32 *hashTable_37;
  U16 *hashTable_26;
  U32 *hashTable_25;
  U16 *hashTable_11;
  U32 *hashTable_10;
  BYTE *e_1;
  BYTE *s_1;
  BYTE *d_1;
  BYTE *e;
  BYTE *s;
  BYTE *d;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  BYTE *local_628;
  BYTE *local_620;
  uint local_614;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  BYTE *local_5f0;
  BYTE *local_5e8;
  uint local_5dc;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  BYTE *local_5b8;
  BYTE *local_5b0;
  uint local_5a4;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  BYTE *local_580;
  BYTE *local_578;
  uint local_56c;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  BYTE *local_548;
  BYTE *local_540;
  uint local_534;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  BYTE *local_510;
  BYTE *local_508;
  uint local_4fc;
  U16 *hashTable_41;
  U32 *hashTable_40;
  BYTE **hashTable_39;
  U16 *hashTable_14;
  U32 *hashTable_13;
  BYTE **hashTable_12;
  U32 h_13;
  U32 h_5;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  uint local_3b4;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  uint local_38c;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  uint local_364;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  uint local_33c;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  uint local_314;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  uint local_2ec;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  uint local_24c;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  uint local_224;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  uint local_1fc;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  uint local_1d4;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  uint local_1ac;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  uint local_184;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  if (((LZ4_dict->internal_donotuse).dictSize < 0x10000) &&
     ((LZ4_dict->internal_donotuse).dictSize < (LZ4_dict->internal_donotuse).currentOffset)) {
    if ((uint)srcSize < 0x7e000001) {
      if (srcSize == 0) {
        *dest = '\0';
        local_f64 = 1;
      }
      else {
        uVar1 = (LZ4_dict->internal_donotuse).currentOffset;
        lVar13 = (long)source - (ulong)uVar1;
        pLVar2 = (LZ4_stream_t_internal *)(LZ4_dict->internal_donotuse).dictionary;
        uVar12 = (LZ4_dict->internal_donotuse).dictSize;
        if (pLVar2 == (LZ4_stream_t_internal *)0x0) {
          local_1040 = (LZ4_byte *)0x0;
        }
        else {
          local_1040 = (LZ4_byte *)((long)pLVar2->hashTable + (ulong)uVar12);
        }
        pBVar14 = (BYTE *)(source + (long)srcSize + -5);
        if (pLVar2 == (LZ4_stream_t_internal *)0x0) {
          local_1048 = (LZ4_byte *)0x0;
        }
        else {
          local_1048 = (LZ4_byte *)((long)pLVar2 + ((ulong)uVar12 - (ulong)uVar1));
        }
        (LZ4_dict->internal_donotuse).dictSize = srcSize + (LZ4_dict->internal_donotuse).dictSize;
        (LZ4_dict->internal_donotuse).currentOffset =
             srcSize + (LZ4_dict->internal_donotuse).currentOffset;
        (LZ4_dict->internal_donotuse).tableType = 2;
        olimit = (BYTE *)dest;
        iend = (BYTE *)source;
        if (0xc < srcSize) {
          rVar15 = LZ4_read_ARCH(source);
          uVar6 = LZ4_isLittleEndian();
          if (uVar6 == 0) {
            local_3b4 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_3b4 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_3b4 = local_3b4 >> 0x14;
          iVar3 = (int)lVar13;
          switch(0x14bb9e) {
          case 0:
            break;
          case 1:
            LZ4_dict->table[local_3b4] = source;
            break;
          case 2:
            *(int *)((long)LZ4_dict + (ulong)local_3b4 * 4) = (int)source - iVar3;
            break;
          case 3:
            *(short *)((long)LZ4_dict + (ulong)local_3b4 * 2) = (short)source - (short)lVar13;
          }
          pBStack_e50 = (BYTE *)(source + 1);
          rVar15 = LZ4_read_ARCH(pBStack_e50);
          uVar6 = LZ4_isLittleEndian();
          if (uVar6 == 0) {
            local_38c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_38c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_38c = local_38c >> 0x14;
          match._0_4_ = local_38c;
LAB_0014bd7e:
          _searchMatchNb_1 = pBStack_e50;
          h_2 = 1;
          current = 0x40;
          pBVar18 = _searchMatchNb_1;
          do {
            do {
              _searchMatchNb_1 = pBVar18;
              uVar11 = (uint)match;
              uVar7 = (int)_searchMatchNb_1 - iVar3;
              uVar6 = *(uint *)((long)LZ4_dict + (ulong)(uint)match * 4);
              pBVar18 = _searchMatchNb_1 + (int)h_2;
              UVar9 = current + 1;
              h_2 = (int)current >> 6;
              if (source + (long)srcSize + -0xb < pBVar18) goto LAB_0014e5a8;
              if (uVar6 < uVar1) {
                token = local_1048 + uVar6;
                dictCtx = pLVar2;
              }
              else {
                token = (BYTE *)(lVar13 + (ulong)uVar6);
                dictCtx = (LZ4_stream_t_internal *)source;
              }
              rVar15 = LZ4_read_ARCH(pBVar18);
              uVar8 = LZ4_isLittleEndian();
              if (uVar8 == 0) {
                local_364 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_364 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
              }
              local_364 = local_364 >> 0x14;
              match._0_4_ = local_364;
              *(uint *)((long)LZ4_dict + (ulong)uVar11 * 4) = uVar7;
              current = UVar9;
            } while ((uVar6 < uVar1 - uVar12) || (uVar6 + 0xffff < uVar7));
            UVar9 = LZ4_read32(token);
            UVar10 = LZ4_read32(_searchMatchNb_1);
          } while (UVar9 != UVar10);
          match._4_4_ = uVar7 - uVar6;
          pBStack_e50 = _searchMatchNb_1;
          while( true ) {
            bVar19 = false;
            if (iend < pBStack_e50 && dictCtx < token) {
              bVar19 = pBStack_e50[-1] == token[-1];
            }
            if (!bVar19) break;
            pBStack_e50 = pBStack_e50 + -1;
            token = token + -1;
          }
          uVar6 = (int)pBStack_e50 - (int)iend;
          filledIp = olimit;
          if (uVar6 < 0xf) {
            *olimit = (char)uVar6 * '\x10';
            olimit = olimit + 1;
          }
          else {
            *olimit = 0xf0;
            olimit = olimit + 1;
            for (limit._4_4_ = uVar6 - 0xf; 0xfe < limit._4_4_; limit._4_4_ = limit._4_4_ + -0xff) {
              *olimit = 0xff;
              olimit = olimit + 1;
            }
            *olimit = (BYTE)limit._4_4_;
            olimit = olimit + 1;
          }
          s = olimit;
          e = iend;
          do {
            *(undefined8 *)s = *(undefined8 *)e;
            s = s + 8;
            e = e + 8;
          } while (s < olimit + uVar6);
          olimit = olimit + uVar6;
          do {
            LZ4_writeLE16(olimit,(U16)match._4_4_);
            olimit = olimit + 2;
            if (dictCtx == pLVar2) {
              _newMatchCode = pBStack_e50 + ((long)local_1040 - (long)token);
              if (pBVar14 < pBStack_e50 + ((long)local_1040 - (long)token)) {
                _newMatchCode = pBVar14;
              }
              pBVar18 = pBStack_e50 + 4;
              local_548 = token + 4;
              local_540 = pBVar18;
              if (pBVar18 < _newMatchCode + -7) {
                rVar15 = LZ4_read_ARCH(local_548);
                rVar16 = LZ4_read_ARCH(pBVar18);
                if ((rVar15 ^ rVar16) == 0) {
                  local_548 = token + 0xc;
                  local_540 = pBStack_e50 + 0xc;
                  goto LAB_0014cb59;
                }
                local_534 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
              }
              else {
LAB_0014cb59:
                for (; local_540 < _newMatchCode + -7; local_540 = local_540 + 8) {
                  rVar15 = LZ4_read_ARCH(local_548);
                  rVar16 = LZ4_read_ARCH(local_540);
                  if ((rVar15 ^ rVar16) != 0) {
                    uVar6 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                    local_534 = ((int)local_540 + uVar6) - (int)pBVar18;
                    goto LAB_0014cd3f;
                  }
                  local_548 = local_548 + 8;
                }
                if (local_540 < _newMatchCode + -3) {
                  UVar9 = LZ4_read32(local_548);
                  UVar10 = LZ4_read32(local_540);
                  if (UVar9 == UVar10) {
                    local_540 = local_540 + 4;
                    local_548 = local_548 + 4;
                  }
                }
                if (local_540 < _newMatchCode + -1) {
                  UVar4 = LZ4_read16(local_548);
                  UVar5 = LZ4_read16(local_540);
                  if (UVar4 == UVar5) {
                    local_540 = local_540 + 2;
                    local_548 = local_548 + 2;
                  }
                }
                if ((local_540 < _newMatchCode) && (*local_548 == *local_540)) {
                  local_540 = local_540 + 1;
                }
                local_534 = (int)local_540 - (int)pBVar18;
              }
LAB_0014cd3f:
              limit._0_4_ = local_534;
              pBStack_e50 = pBStack_e50 + (ulong)local_534 + 4;
              if (pBStack_e50 == _newMatchCode) {
                local_578 = _newMatchCode;
                local_580 = (BYTE *)source;
                if (_newMatchCode < source + (long)srcSize + -0xc) {
                  rVar15 = LZ4_read_ARCH(source);
                  rVar16 = LZ4_read_ARCH(_newMatchCode);
                  if ((rVar15 ^ rVar16) == 0) {
                    local_578 = _newMatchCode + 8;
                    local_580 = (BYTE *)(source + 8);
                    goto LAB_0014ce49;
                  }
                  local_56c = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                }
                else {
LAB_0014ce49:
                  for (; local_578 < source + (long)srcSize + -0xc; local_578 = local_578 + 8) {
                    rVar15 = LZ4_read_ARCH(local_580);
                    rVar16 = LZ4_read_ARCH(local_578);
                    if ((rVar15 ^ rVar16) != 0) {
                      uVar6 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                      local_56c = ((int)local_578 + uVar6) - (int)_newMatchCode;
                      goto LAB_0014d02f;
                    }
                    local_580 = local_580 + 8;
                  }
                  if (local_578 < source + (long)srcSize + -8) {
                    UVar9 = LZ4_read32(local_580);
                    UVar10 = LZ4_read32(local_578);
                    if (UVar9 == UVar10) {
                      local_578 = local_578 + 4;
                      local_580 = local_580 + 4;
                    }
                  }
                  if (local_578 < source + (long)srcSize + -6) {
                    UVar4 = LZ4_read16(local_580);
                    UVar5 = LZ4_read16(local_578);
                    if (UVar4 == UVar5) {
                      local_578 = local_578 + 2;
                      local_580 = local_580 + 2;
                    }
                  }
                  if ((local_578 < pBVar14) && (*local_580 == *local_578)) {
                    local_578 = local_578 + 1;
                  }
                  local_56c = (int)local_578 - (int)_newMatchCode;
                }
LAB_0014d02f:
                limit._0_4_ = local_56c + local_534;
                pBStack_e50 = pBStack_e50 + local_56c;
              }
            }
            else {
              pBVar18 = pBStack_e50 + 4;
              local_510 = token + 4;
              local_508 = pBVar18;
              if (pBVar18 < source + (long)srcSize + -0xc) {
                rVar15 = LZ4_read_ARCH(local_510);
                rVar16 = LZ4_read_ARCH(pBVar18);
                if ((rVar15 ^ rVar16) == 0) {
                  local_510 = token + 0xc;
                  local_508 = pBStack_e50 + 0xc;
                  goto LAB_0014d145;
                }
                local_4fc = LZ4_NbCommonBytes(rVar15 ^ rVar16);
              }
              else {
LAB_0014d145:
                for (; local_508 < source + (long)srcSize + -0xc; local_508 = local_508 + 8) {
                  rVar15 = LZ4_read_ARCH(local_510);
                  rVar16 = LZ4_read_ARCH(local_508);
                  if ((rVar15 ^ rVar16) != 0) {
                    uVar6 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                    local_4fc = ((int)local_508 + uVar6) - (int)pBVar18;
                    goto LAB_0014d32b;
                  }
                  local_510 = local_510 + 8;
                }
                if (local_508 < source + (long)srcSize + -8) {
                  UVar9 = LZ4_read32(local_510);
                  UVar10 = LZ4_read32(local_508);
                  if (UVar9 == UVar10) {
                    local_508 = local_508 + 4;
                    local_510 = local_510 + 4;
                  }
                }
                if (local_508 < source + (long)srcSize + -6) {
                  UVar4 = LZ4_read16(local_510);
                  UVar5 = LZ4_read16(local_508);
                  if (UVar4 == UVar5) {
                    local_508 = local_508 + 2;
                    local_510 = local_510 + 2;
                  }
                }
                if ((local_508 < pBVar14) && (*local_510 == *local_508)) {
                  local_508 = local_508 + 1;
                }
                local_4fc = (int)local_508 - (int)pBVar18;
              }
LAB_0014d32b:
              limit._0_4_ = local_4fc;
              pBStack_e50 = pBStack_e50 + (ulong)local_4fc + 4;
            }
            if ((uint)limit < 0xf) {
              *filledIp = *filledIp + (char)(uint)limit;
            }
            else {
              *filledIp = *filledIp + '\x0f';
              limit._0_4_ = (uint)limit - 0xf;
              LZ4_write32(olimit,0xffffffff);
              for (; 0x3fb < (uint)limit; limit._0_4_ = (uint)limit - 0x3fc) {
                olimit = olimit + 4;
                LZ4_write32(olimit,0xffffffff);
              }
              pBVar18 = olimit + (ulong)(uint)limit / 0xff;
              olimit = pBVar18 + 1;
              *pBVar18 = (BYTE)((ulong)(uint)limit % 0xff);
            }
            iend = pBStack_e50;
            if (source + (long)srcSize + -0xb <= pBStack_e50) break;
            pBVar18 = pBStack_e50 + -2;
            rVar15 = LZ4_read_ARCH(pBVar18);
            uVar6 = LZ4_isLittleEndian();
            if (uVar6 == 0) {
              local_33c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_33c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
            }
            local_33c = local_33c >> 0x14;
            switch(0x14d9d9) {
            case 0:
              break;
            case 1:
              LZ4_dict->table[local_33c] = pBVar18;
              break;
            case 2:
              *(int *)((long)LZ4_dict + (ulong)local_33c * 4) = (int)pBVar18 - iVar3;
              break;
            case 3:
              *(short *)((long)LZ4_dict + (ulong)local_33c * 2) = (short)pBVar18 - (short)lVar13;
            }
            rVar15 = LZ4_read_ARCH(pBStack_e50);
            uVar6 = LZ4_isLittleEndian();
            if (uVar6 == 0) {
              local_314 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_314 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
            }
            local_314 = local_314 >> 0x14;
            uVar11 = (int)pBStack_e50 - iVar3;
            uVar6 = *(uint *)((long)LZ4_dict + (ulong)local_314 * 4);
            if (uVar6 < uVar1) {
              token = local_1048 + uVar6;
              dictCtx = pLVar2;
            }
            else {
              token = (BYTE *)(lVar13 + (ulong)uVar6);
              dictCtx = (LZ4_stream_t_internal *)source;
            }
            *(uint *)((long)LZ4_dict + (ulong)local_314 * 4) = uVar11;
            if ((uVar6 < uVar1 - uVar12) || (uVar6 + 0xffff < uVar11)) goto LAB_0014e42e;
            UVar9 = LZ4_read32(token);
            UVar10 = LZ4_read32(pBStack_e50);
            if (UVar9 != UVar10) goto LAB_0014e42e;
            filledIp = olimit;
            *olimit = '\0';
            match._4_4_ = uVar11 - uVar6;
            olimit = olimit + 1;
          } while( true );
        }
LAB_0014e5a8:
        pcVar17 = source + ((long)srcSize - (long)iend);
        if (pcVar17 < (char *)0xf) {
          *olimit = (char)pcVar17 * '\x10';
          olimit = olimit + 1;
        }
        else {
          *olimit = 0xf0;
          pBVar14 = olimit;
          for (local_f60 = pcVar17 + -0xf; olimit = pBVar14 + 1, (char *)0xfe < local_f60;
              local_f60 = local_f60 + -0xff) {
            *olimit = 0xff;
            pBVar14 = olimit;
          }
          *olimit = (BYTE)local_f60;
          olimit = pBVar14 + 2;
        }
        memcpy(olimit,iend,(size_t)pcVar17);
        local_f64 = ((int)pcVar17 + (int)olimit) - (int)dest;
      }
    }
    else {
      local_f64 = 0;
    }
    local_101c = local_f64;
  }
  else {
    if ((uint)srcSize < 0x7e000001) {
      if (srcSize == 0) {
        *dest = '\0';
        local_fac = 1;
      }
      else {
        uVar1 = (LZ4_dict->internal_donotuse).currentOffset;
        lVar13 = (long)source - (ulong)uVar1;
        pLVar2 = (LZ4_stream_t_internal *)(LZ4_dict->internal_donotuse).dictionary;
        if (pLVar2 == (LZ4_stream_t_internal *)0x0) {
          local_1138 = (LZ4_byte *)0x0;
        }
        else {
          local_1138 = (LZ4_byte *)
                       ((long)pLVar2->hashTable + (ulong)(LZ4_dict->internal_donotuse).dictSize);
        }
        pBVar14 = (BYTE *)(source + (long)srcSize + -5);
        if (pLVar2 == (LZ4_stream_t_internal *)0x0) {
          local_1140 = (LZ4_byte *)0x0;
        }
        else {
          local_1140 = (LZ4_byte *)
                       ((long)pLVar2 +
                       ((ulong)(LZ4_dict->internal_donotuse).dictSize - (ulong)uVar1));
        }
        (LZ4_dict->internal_donotuse).dictSize = srcSize + (LZ4_dict->internal_donotuse).dictSize;
        (LZ4_dict->internal_donotuse).currentOffset =
             srcSize + (LZ4_dict->internal_donotuse).currentOffset;
        (LZ4_dict->internal_donotuse).tableType = 2;
        olimit_1 = (BYTE *)dest;
        iend_1 = (BYTE *)source;
        if (0xc < srcSize) {
          rVar15 = LZ4_read_ARCH(source);
          uVar12 = LZ4_isLittleEndian();
          if (uVar12 == 0) {
            local_24c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_24c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_24c = local_24c >> 0x14;
          iVar3 = (int)lVar13;
          switch(0x14ef3c) {
          case 0:
            break;
          case 1:
            LZ4_dict->table[local_24c] = source;
            break;
          case 2:
            *(int *)((long)LZ4_dict + (ulong)local_24c * 4) = (int)source - iVar3;
            break;
          case 3:
            *(short *)((long)LZ4_dict + (ulong)local_24c * 2) = (short)source - (short)lVar13;
          }
          pBStack_c78 = (BYTE *)(source + 1);
          rVar15 = LZ4_read_ARCH(pBStack_c78);
          uVar12 = LZ4_isLittleEndian();
          if (uVar12 == 0) {
            local_224 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_224 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_224 = local_224 >> 0x14;
          match_1._0_4_ = local_224;
LAB_0014f104:
          _searchMatchNb_3 = pBStack_c78;
          h_10 = 1;
          current_2 = 0x40;
          pBVar18 = _searchMatchNb_3;
          do {
            do {
              _searchMatchNb_3 = pBVar18;
              uVar6 = (uint)match_1;
              uVar11 = (int)_searchMatchNb_3 - iVar3;
              uVar12 = *(uint *)((long)LZ4_dict + (ulong)(uint)match_1 * 4);
              pBVar18 = _searchMatchNb_3 + (int)h_10;
              UVar9 = current_2 + 1;
              h_10 = (int)current_2 >> 6;
              if (source + (long)srcSize + -0xb < pBVar18) goto LAB_0015188f;
              if (uVar12 < uVar1) {
                token_1 = local_1140 + uVar12;
                dictCtx_1 = pLVar2;
              }
              else {
                token_1 = (BYTE *)(lVar13 + (ulong)uVar12);
                dictCtx_1 = (LZ4_stream_t_internal *)source;
              }
              rVar15 = LZ4_read_ARCH(pBVar18);
              uVar7 = LZ4_isLittleEndian();
              if (uVar7 == 0) {
                local_1fc = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_1fc = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
              }
              local_1fc = local_1fc >> 0x14;
              match_1._0_4_ = local_1fc;
              *(uint *)((long)LZ4_dict + (ulong)uVar6 * 4) = uVar11;
              current_2 = UVar9;
            } while (uVar12 + 0xffff < uVar11);
            UVar9 = LZ4_read32(token_1);
            UVar10 = LZ4_read32(_searchMatchNb_3);
          } while (UVar9 != UVar10);
          match_1._4_4_ = uVar11 - uVar12;
          pBStack_c78 = _searchMatchNb_3;
          while( true ) {
            bVar19 = false;
            if (iend_1 < pBStack_c78 && dictCtx_1 < token_1) {
              bVar19 = pBStack_c78[-1] == token_1[-1];
            }
            if (!bVar19) break;
            pBStack_c78 = pBStack_c78 + -1;
            token_1 = token_1 + -1;
          }
          uVar12 = (int)pBStack_c78 - (int)iend_1;
          filledIp_1 = olimit_1;
          if (uVar12 < 0xf) {
            *olimit_1 = (char)uVar12 * '\x10';
            olimit_1 = olimit_1 + 1;
          }
          else {
            *olimit_1 = 0xf0;
            olimit_1 = olimit_1 + 1;
            for (limit_1._4_4_ = uVar12 - 0xf; 0xfe < limit_1._4_4_;
                limit_1._4_4_ = limit_1._4_4_ + -0xff) {
              *olimit_1 = 0xff;
              olimit_1 = olimit_1 + 1;
            }
            *olimit_1 = (BYTE)limit_1._4_4_;
            olimit_1 = olimit_1 + 1;
          }
          s_1 = olimit_1;
          e_1 = iend_1;
          do {
            *(undefined8 *)s_1 = *(undefined8 *)e_1;
            s_1 = s_1 + 8;
            e_1 = e_1 + 8;
          } while (s_1 < olimit_1 + uVar12);
          olimit_1 = olimit_1 + uVar12;
          do {
            LZ4_writeLE16(olimit_1,(U16)match_1._4_4_);
            olimit_1 = olimit_1 + 2;
            if (dictCtx_1 == pLVar2) {
              _newMatchCode_1 = pBStack_c78 + ((long)local_1138 - (long)token_1);
              if (pBVar14 < pBStack_c78 + ((long)local_1138 - (long)token_1)) {
                _newMatchCode_1 = pBVar14;
              }
              pBVar18 = pBStack_c78 + 4;
              local_5f0 = token_1 + 4;
              local_5e8 = pBVar18;
              if (pBVar18 < _newMatchCode_1 + -7) {
                rVar15 = LZ4_read_ARCH(local_5f0);
                rVar16 = LZ4_read_ARCH(pBVar18);
                if ((rVar15 ^ rVar16) == 0) {
                  local_5f0 = token_1 + 0xc;
                  local_5e8 = pBStack_c78 + 0xc;
                  goto LAB_0014feb8;
                }
                local_5dc = LZ4_NbCommonBytes(rVar15 ^ rVar16);
              }
              else {
LAB_0014feb8:
                for (; local_5e8 < _newMatchCode_1 + -7; local_5e8 = local_5e8 + 8) {
                  rVar15 = LZ4_read_ARCH(local_5f0);
                  rVar16 = LZ4_read_ARCH(local_5e8);
                  if ((rVar15 ^ rVar16) != 0) {
                    uVar12 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                    local_5dc = ((int)local_5e8 + uVar12) - (int)pBVar18;
                    goto LAB_0015009e;
                  }
                  local_5f0 = local_5f0 + 8;
                }
                if (local_5e8 < _newMatchCode_1 + -3) {
                  UVar9 = LZ4_read32(local_5f0);
                  UVar10 = LZ4_read32(local_5e8);
                  if (UVar9 == UVar10) {
                    local_5e8 = local_5e8 + 4;
                    local_5f0 = local_5f0 + 4;
                  }
                }
                if (local_5e8 < _newMatchCode_1 + -1) {
                  UVar4 = LZ4_read16(local_5f0);
                  UVar5 = LZ4_read16(local_5e8);
                  if (UVar4 == UVar5) {
                    local_5e8 = local_5e8 + 2;
                    local_5f0 = local_5f0 + 2;
                  }
                }
                if ((local_5e8 < _newMatchCode_1) && (*local_5f0 == *local_5e8)) {
                  local_5e8 = local_5e8 + 1;
                }
                local_5dc = (int)local_5e8 - (int)pBVar18;
              }
LAB_0015009e:
              limit_1._0_4_ = local_5dc;
              pBStack_c78 = pBStack_c78 + (ulong)local_5dc + 4;
              if (pBStack_c78 == _newMatchCode_1) {
                local_620 = _newMatchCode_1;
                local_628 = (BYTE *)source;
                if (_newMatchCode_1 < source + (long)srcSize + -0xc) {
                  rVar15 = LZ4_read_ARCH(source);
                  rVar16 = LZ4_read_ARCH(_newMatchCode_1);
                  if ((rVar15 ^ rVar16) == 0) {
                    local_620 = _newMatchCode_1 + 8;
                    local_628 = (BYTE *)(source + 8);
                    goto LAB_001501a8;
                  }
                  local_614 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                }
                else {
LAB_001501a8:
                  for (; local_620 < source + (long)srcSize + -0xc; local_620 = local_620 + 8) {
                    rVar15 = LZ4_read_ARCH(local_628);
                    rVar16 = LZ4_read_ARCH(local_620);
                    if ((rVar15 ^ rVar16) != 0) {
                      uVar12 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                      local_614 = ((int)local_620 + uVar12) - (int)_newMatchCode_1;
                      goto LAB_0015038e;
                    }
                    local_628 = local_628 + 8;
                  }
                  if (local_620 < source + (long)srcSize + -8) {
                    UVar9 = LZ4_read32(local_628);
                    UVar10 = LZ4_read32(local_620);
                    if (UVar9 == UVar10) {
                      local_620 = local_620 + 4;
                      local_628 = local_628 + 4;
                    }
                  }
                  if (local_620 < source + (long)srcSize + -6) {
                    UVar4 = LZ4_read16(local_628);
                    UVar5 = LZ4_read16(local_620);
                    if (UVar4 == UVar5) {
                      local_620 = local_620 + 2;
                      local_628 = local_628 + 2;
                    }
                  }
                  if ((local_620 < pBVar14) && (*local_628 == *local_620)) {
                    local_620 = local_620 + 1;
                  }
                  local_614 = (int)local_620 - (int)_newMatchCode_1;
                }
LAB_0015038e:
                limit_1._0_4_ = local_614 + local_5dc;
                pBStack_c78 = pBStack_c78 + local_614;
              }
            }
            else {
              pBVar18 = pBStack_c78 + 4;
              local_5b8 = token_1 + 4;
              local_5b0 = pBVar18;
              if (pBVar18 < source + (long)srcSize + -0xc) {
                rVar15 = LZ4_read_ARCH(local_5b8);
                rVar16 = LZ4_read_ARCH(pBVar18);
                if ((rVar15 ^ rVar16) == 0) {
                  local_5b8 = token_1 + 0xc;
                  local_5b0 = pBStack_c78 + 0xc;
                  goto LAB_001504a4;
                }
                local_5a4 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
              }
              else {
LAB_001504a4:
                for (; local_5b0 < source + (long)srcSize + -0xc; local_5b0 = local_5b0 + 8) {
                  rVar15 = LZ4_read_ARCH(local_5b8);
                  rVar16 = LZ4_read_ARCH(local_5b0);
                  if ((rVar15 ^ rVar16) != 0) {
                    uVar12 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                    local_5a4 = ((int)local_5b0 + uVar12) - (int)pBVar18;
                    goto LAB_0015068a;
                  }
                  local_5b8 = local_5b8 + 8;
                }
                if (local_5b0 < source + (long)srcSize + -8) {
                  UVar9 = LZ4_read32(local_5b8);
                  UVar10 = LZ4_read32(local_5b0);
                  if (UVar9 == UVar10) {
                    local_5b0 = local_5b0 + 4;
                    local_5b8 = local_5b8 + 4;
                  }
                }
                if (local_5b0 < source + (long)srcSize + -6) {
                  UVar4 = LZ4_read16(local_5b8);
                  UVar5 = LZ4_read16(local_5b0);
                  if (UVar4 == UVar5) {
                    local_5b0 = local_5b0 + 2;
                    local_5b8 = local_5b8 + 2;
                  }
                }
                if ((local_5b0 < pBVar14) && (*local_5b8 == *local_5b0)) {
                  local_5b0 = local_5b0 + 1;
                }
                local_5a4 = (int)local_5b0 - (int)pBVar18;
              }
LAB_0015068a:
              limit_1._0_4_ = local_5a4;
              pBStack_c78 = pBStack_c78 + (ulong)local_5a4 + 4;
            }
            if ((uint)limit_1 < 0xf) {
              *filledIp_1 = *filledIp_1 + (char)(uint)limit_1;
            }
            else {
              *filledIp_1 = *filledIp_1 + '\x0f';
              limit_1._0_4_ = (uint)limit_1 - 0xf;
              LZ4_write32(olimit_1,0xffffffff);
              for (; 0x3fb < (uint)limit_1; limit_1._0_4_ = (uint)limit_1 - 0x3fc) {
                olimit_1 = olimit_1 + 4;
                LZ4_write32(olimit_1,0xffffffff);
              }
              pBVar18 = olimit_1 + (ulong)(uint)limit_1 / 0xff;
              olimit_1 = pBVar18 + 1;
              *pBVar18 = (BYTE)((ulong)(uint)limit_1 % 0xff);
            }
            iend_1 = pBStack_c78;
            if (source + (long)srcSize + -0xb <= pBStack_c78) break;
            pBVar18 = pBStack_c78 + -2;
            rVar15 = LZ4_read_ARCH(pBVar18);
            uVar12 = LZ4_isLittleEndian();
            if (uVar12 == 0) {
              local_1d4 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_1d4 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
            }
            local_1d4 = local_1d4 >> 0x14;
            switch(0x150d08) {
            case 0:
              break;
            case 1:
              LZ4_dict->table[local_1d4] = pBVar18;
              break;
            case 2:
              *(int *)((long)LZ4_dict + (ulong)local_1d4 * 4) = (int)pBVar18 - iVar3;
              break;
            case 3:
              *(short *)((long)LZ4_dict + (ulong)local_1d4 * 2) = (short)pBVar18 - (short)lVar13;
            }
            rVar15 = LZ4_read_ARCH(pBStack_c78);
            uVar12 = LZ4_isLittleEndian();
            if (uVar12 == 0) {
              local_1ac = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_1ac = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
            }
            local_1ac = local_1ac >> 0x14;
            uVar6 = (int)pBStack_c78 - iVar3;
            uVar12 = *(uint *)((long)LZ4_dict + (ulong)local_1ac * 4);
            if (uVar12 < uVar1) {
              token_1 = local_1140 + uVar12;
              dictCtx_1 = pLVar2;
            }
            else {
              token_1 = (BYTE *)(lVar13 + (ulong)uVar12);
              dictCtx_1 = (LZ4_stream_t_internal *)source;
            }
            *(uint *)((long)LZ4_dict + (ulong)local_1ac * 4) = uVar6;
            if (uVar12 + 0xffff < uVar6) goto LAB_0015172d;
            UVar9 = LZ4_read32(token_1);
            UVar10 = LZ4_read32(pBStack_c78);
            if (UVar9 != UVar10) goto LAB_0015172d;
            filledIp_1 = olimit_1;
            *olimit_1 = '\0';
            match_1._4_4_ = uVar6 - uVar12;
            olimit_1 = olimit_1 + 1;
          } while( true );
        }
LAB_0015188f:
        pcVar17 = source + ((long)srcSize - (long)iend_1);
        if (pcVar17 < (char *)0xf) {
          *olimit_1 = (char)pcVar17 * '\x10';
          olimit_1 = olimit_1 + 1;
        }
        else {
          *olimit_1 = 0xf0;
          pBVar14 = olimit_1;
          for (local_d88 = pcVar17 + -0xf; olimit_1 = pBVar14 + 1, (char *)0xfe < local_d88;
              local_d88 = local_d88 + -0xff) {
            *olimit_1 = 0xff;
            pBVar14 = olimit_1;
          }
          *olimit_1 = (BYTE)local_d88;
          olimit_1 = pBVar14 + 2;
        }
        memcpy(olimit_1,iend_1,(size_t)pcVar17);
        local_fac = ((int)pcVar17 + (int)olimit_1) - (int)dest;
      }
    }
    else {
      local_fac = 0;
    }
    local_101c = local_fac;
  }
  (LZ4_dict->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return local_101c;
LAB_0015172d:
  pBStack_c78 = pBStack_c78 + 1;
  rVar15 = LZ4_read_ARCH(pBStack_c78);
  uVar12 = LZ4_isLittleEndian();
  if (uVar12 == 0) {
    local_184 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_184 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
  }
  local_184 = local_184 >> 0x14;
  match_1._0_4_ = local_184;
  goto LAB_0014f104;
LAB_0014e42e:
  pBStack_e50 = pBStack_e50 + 1;
  rVar15 = LZ4_read_ARCH(pBStack_e50);
  uVar6 = LZ4_isLittleEndian();
  if (uVar6 == 0) {
    local_2ec = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_2ec = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
  }
  local_2ec = local_2ec >> 0x14;
  match._0_4_ = local_2ec;
  goto LAB_0014bd7e;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}